

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O2

int sprint_dns_answers(char *dest,char *message)

{
  uint16_t uVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  ulong uVar6;
  char *pcVar7;
  IP *pIVar8;
  int j;
  long lVar9;
  int local_2c08;
  answer answers [20];
  
  uVar2 = read_dns_answers(answers,message);
  builtin_strncpy(dest,"-------ANSWERS----------\n",0x1a);
  pcVar7 = dest + 0x19;
  if ((int)uVar2 < 1) {
    uVar2 = 0;
  }
  pIVar8 = &answers[0].address;
  uVar6 = 0;
  do {
    if (uVar6 == uVar2) {
      local_2c08 = (int)dest;
      return (int)pcVar7 - local_2c08;
    }
    pcVar4 = debugstr(0xe,(uint)answers[uVar6].type);
    pcVar5 = "Unknow";
    if (answers[uVar6].class_ == 1) {
      pcVar5 = "IN";
    }
    iVar3 = sprintf(pcVar7,"%s type:%s class:%s ttl:%d",answers + uVar6,pcVar4,pcVar5,
                    (ulong)answers[uVar6].ttl);
    pcVar7 = pcVar7 + iVar3;
    uVar1 = answers[uVar6].type;
    if (uVar1 == 1) {
      pcVar7[2] = '\0';
      pcVar7[0] = 'i';
      pcVar7[1] = 'p';
      pcVar7 = pcVar7 + 2;
      for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
        iVar3 = sprintf(pcVar7,":%d",(ulong)*(byte *)((long)&pIVar8->addr + lVar9));
        pcVar7 = pcVar7 + iVar3;
      }
    }
    else {
      if (uVar1 != 5) {
        if (uVar1 != 0x1c) goto LAB_001040c4;
        for (lVar9 = 0; lVar9 != 8; lVar9 = lVar9 + 1) {
          iVar3 = sprintf(pcVar7,":%04x",(ulong)*(ushort *)((long)&pIVar8->addr + lVar9 * 2));
          pcVar7 = pcVar7 + iVar3;
        }
      }
      iVar3 = sprintf(pcVar7,"RRTYPE_CNAME:%s",answers[uVar6].cname);
      pcVar7 = pcVar7 + iVar3;
    }
LAB_001040c4:
    pcVar7[0] = '\n';
    pcVar7[1] = '\0';
    pcVar7 = pcVar7 + 1;
    uVar6 = uVar6 + 1;
    pIVar8 = (IP *)((long)(pIVar8 + 0x11) + 0x10);
  } while( true );
}

Assistant:

int sprint_dns_answers(char *dest, char *message) {
  struct answer answers[20];
  char *dest_ = dest;
  int n = read_dns_answers(answers, message);
  dest += sprintf(dest, "-------ANSWERS----------\n");
  for (int i = 0; i < n; i++) {
    dest += sprintf(dest, "%s type:%s class:%s ttl:%d", answers[i].name,
                    debugstr(DEBUG_PRINT_TYPE_type, answers[i].type),
                    debugstr(DEBUG_PRINT_TYPE_class, answers[i].class_),
                    answers[i].ttl);
    switch (answers[i].type) {
    case RRTYPE_A:
      dest += sprintf(dest, "ip");
      for (int j = 0; j < 4; j++)
        dest += sprintf(dest, ":%d", answers[i].address.addr.v4byte[j]);
      break;
    case RRTYPE_AAAA:
      for (int j = 0; j < 8; j++)
        dest += sprintf(dest, ":%04x", answers[i].address.addr.v6byte[j]);
      ;
    case RRTYPE_CNAME:
      dest += sprintf(dest, "RRTYPE_CNAME:%s", answers[i].cname);
      // free(&answers[i].cname);
    default:
      break;
    }
    dest += sprintf(dest, "\n");
  }
  return dest - dest_;
}